

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcProduct::IfcProduct(IfcProduct *this,void **vtt)

{
  void **vtt_local;
  IfcProduct *this_local;
  
  IfcObject::IfcObject(&this->super_IfcObject,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcProduct,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcProduct,_2UL> *)
             &(this->super_IfcObject).field_0xd0,vtt + 0x10);
  *(void **)&this->super_IfcObject = *vtt;
  *(void **)(&(this->super_IfcObject).field_0x0 + *(long *)(*(long *)&this->super_IfcObject + -0x18)
            ) = vtt[0x12];
  *(void **)&(this->super_IfcObject).field_0x88 = vtt[0x13];
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)vtt[0x14];
  *(void **)&(this->super_IfcObject).field_0xd0 = vtt[0x15];
  STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectPlacement>_>::Maybe
            ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectPlacement>_> *)
             &(this->super_IfcObject).field_0xe0);
  STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProductRepresentation>_>::Maybe
            (&this->Representation);
  return;
}

Assistant:

IfcProduct() : Object("IfcProduct") {}